

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O3

void __thiscall Hpipe::Cond::Range::write_cpp(Range *this,ostream *os,string *var,bool in_or)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 in_register_00000009;
  size_type sVar6;
  char *pcVar7;
  pointer pcVar8;
  int *piVar9;
  
  iVar4 = this->beg;
  if ((int)CONCAT71(in_register_00000009,in_or) == 0) {
LAB_00143f2c:
    bVar3 = false;
LAB_00143f2e:
    iVar1 = this->end;
    if (iVar4 == iVar1) goto LAB_00143f3a;
    if (iVar1 < 0xff && iVar4 != 0) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(var->_M_dataplus)._M_p,var->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," >= ",4);
      poVar5 = cc(poVar5,this->beg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," and ",5);
      pcVar8 = (var->_M_dataplus)._M_p;
      sVar6 = var->_M_string_length;
LAB_00143fef:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," <= ",4);
      iVar4 = this->end;
      goto LAB_0014400f;
    }
    if (iVar1 < 0xff) {
      pcVar8 = (var->_M_dataplus)._M_p;
      sVar6 = var->_M_string_length;
      poVar5 = os;
      goto LAB_00143fef;
    }
    if (iVar4 != 0) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(var->_M_dataplus)._M_p,var->_M_string_length);
      pcVar7 = " >= ";
      goto LAB_00143f56;
    }
    iVar4 = 0;
    if ((this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (this->exceptions).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
    goto LAB_0014401c;
    std::__ostream_insert<char,std::char_traits<char>>(os,"true",4);
  }
  else {
    if (iVar4 != this->end) {
      if ((iVar4 == 0 || 0xfe < this->end) &&
         ((this->exceptions).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
          (this->exceptions).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start))
      goto LAB_00143f2c;
      std::__ostream_insert<char,std::char_traits<char>>(os,"( ",2);
      iVar4 = this->beg;
      bVar3 = true;
      goto LAB_00143f2e;
    }
    bVar3 = false;
LAB_00143f3a:
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(var->_M_dataplus)._M_p,var->_M_string_length);
    pcVar7 = " == ";
LAB_00143f56:
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,4);
    iVar4 = this->beg;
LAB_0014400f:
    cc(poVar5,iVar4);
  }
  iVar4 = 1;
LAB_0014401c:
  piVar2 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar9 = (this->exceptions).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar9 != piVar2; piVar9 = piVar9 + 1) {
    iVar1 = *piVar9;
    pcVar7 = " and ";
    if (iVar4 == 0) {
      pcVar7 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,(ulong)(iVar4 != 0) * 5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(var->_M_dataplus)._M_p,var->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
    cc(poVar5,iVar1);
    iVar4 = iVar4 + 1;
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os," )",2);
    return;
  }
  return;
}

Assistant:

void Cond::Range::write_cpp( std::ostream &os, const std::string &var, bool in_or ) const {
    bool par = in_or and beg != end and ( ( beg and end < 255 ) or exceptions.size() );
    if ( par )
        os << "( ";

    int cpt = 1;
    if ( beg == end )
        cc( os << var << " == ", beg );
    else if ( beg and end < 255 )
        cc( cc( os <<  var << " >= ", beg ) << " and " << var << " <= ", end );
    else if ( end < 255 )
        cc( os << var << " <= ", end );
    else if ( beg )
        cc( os << var << " >= ", beg );
    else if ( exceptions.empty() )
        os << "true";
    else
        cpt = 0;

    for( int v : exceptions )
        cc( os << ( cpt++ ? " and " : "" ) << var << " != ", v );

    if ( par )
        os << " )";
}